

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall YAML::Emitter::PrepareTopNode(Emitter *this,value child)

{
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var1;
  size_t sVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  
  if (child != NoType) {
    sVar2 = EmitterState::CurGroupChildCount
                      ((this->m_pState)._M_t.
                       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                       .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
    if ((sVar2 != 0) && ((this->m_stream).m_col != 0)) {
      EmitBeginDoc(this);
    }
    if (child < (BlockMap|Property)) {
      if ((0x2eU >> (child & 0x1f) & 1) != 0) {
        _Var1._M_head_impl =
             (this->m_pState)._M_t.
             super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>.
             _M_t.
             super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
             super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
        SpaceOrIndentTo(this,(bool)(((_Var1._M_head_impl)->m_hasTag |
                                    (_Var1._M_head_impl)->m_hasAnchor) & 1),0);
        return;
      }
      if (((0x50U >> (child & 0x1f) & 1) != 0) &&
         (((_Var1._M_head_impl =
                 (this->m_pState)._M_t.
                 super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                 .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,
           (_Var1._M_head_impl)->m_hasAnchor != false || ((_Var1._M_head_impl)->m_hasTag != false))
          || ((_Var1._M_head_impl)->m_hasNonContent == true)))) {
        ostream_wrapper::write
                  (&this->m_stream,0x76ce52,(void *)0x1,CONCAT71(in_register_00000009,in_CL));
        return;
      }
    }
  }
  return;
}

Assistant:

void Emitter::PrepareTopNode(EmitterNodeType::value child) {
  if (child == EmitterNodeType::NoType)
    return;

  if (m_pState->CurGroupChildCount() > 0 && m_stream.col() > 0)
    EmitBeginDoc();

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      // TODO: if we were writing null, and
      // we wanted it blank, we wouldn't want a space
      SpaceOrIndentTo(m_pState->HasBegunContent(), 0);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      if (m_pState->HasBegunNode())
        m_stream << "\n";
      break;
  }
}